

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O1

Guild_Member * __thiscall Guild_Create::GetMember(Guild_Create *this,string *character)

{
  pointer psVar1;
  Guild_Create *pGVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t __n;
  int iVar3;
  pointer psVar4;
  bool bVar5;
  string local_50;
  
  util::lowercase(&local_50,character);
  std::__cxx11::string::operator=((string *)character,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  psVar4 = (this->members).
           super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->members).
           super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar4 == psVar1) {
      return (Guild_Member *)0x0;
    }
    pGVar2 = (Guild_Create *)
             (psVar4->super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar4->super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    __n = character->_M_string_length;
    if (__n == ((string *)&pGVar2->super_enable_shared_from_this<Guild_Create>)->_M_string_length) {
      if (__n == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp((character->_M_dataplus)._M_p,
                     (((string *)&pGVar2->super_enable_shared_from_this<Guild_Create>)->_M_dataplus)
                     ._M_p,__n);
        bVar5 = iVar3 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      this = pGVar2;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (bVar5) break;
    psVar4 = psVar4 + 1;
  }
  return (Guild_Member *)this;
}

Assistant:

Guild_Member *Guild_Create::GetMember(std::string character)
{
	character = util::lowercase(character);

	UTIL_FOREACH(this->members, check)
	{
		if (character == check->name)
		{
			return check.get();
		}
	}

	return 0;
}